

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O1

char * extract_dir_from_path(char *path)

{
  char *n;
  int iVar1;
  char *pcVar2;
  
  iVar1 = fl_filename_isdir(path);
  if (iVar1 == 0) {
    if (*path == '/') {
      if (extract_dir_from_path::dir != (char *)0x0) {
        free(extract_dir_from_path::dir);
      }
      extract_dir_from_path::dir = strdup(path);
      do {
        n = extract_dir_from_path::dir;
        pcVar2 = strrchr(extract_dir_from_path::dir,0x2f);
        pcVar2[pcVar2 == n] = '\0';
        iVar1 = fl_filename_isdir(n);
        path = extract_dir_from_path::dir;
      } while (iVar1 == 0);
    }
    else {
      path = (char *)0x0;
    }
  }
  return path;
}

Assistant:

static char *extract_dir_from_path(const char *path)
{
  static char *dir = NULL;
  if (fl_filename_isdir(path)) {
    return (char*)path;
  }
  if (*path != '/') return NULL;
  if (dir) free(dir);
  dir = strdup(path);
  do {
    char *p = strrchr(dir, '/');
    if (p == dir) p++;
    *p = 0;
    }
  while (!fl_filename_isdir(dir));
  return dir;
}